

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O3

string * __thiscall
CLI::Option::help_name_abi_cxx11_(string *__return_storage_ptr__,Option *this,bool opt_only)

{
  ostream *poVar1;
  stringstream out;
  string local_1e8;
  string local_1c8;
  stringstream local_1a8 [16];
  ostream local_198 [112];
  ios_base local_128 [264];
  
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  get_name_abi_cxx11_(&local_1c8,this,opt_only);
  poVar1 = ::std::__ostream_insert<char,std::char_traits<char>>
                     (local_198,local_1c8._M_dataplus._M_p,local_1c8._M_string_length);
  help_aftername_abi_cxx11_(&local_1e8,this);
  ::std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
    operator_delete(local_1e8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
    operator_delete(local_1c8._M_dataplus._M_p);
  }
  ::std::__cxx11::stringbuf::str();
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  ::std::ios_base::~ios_base(local_128);
  return __return_storage_ptr__;
}

Assistant:

std::string help_name(bool opt_only = false) const {
        std::stringstream out;
        out << get_name(opt_only) << help_aftername();
        return out.str();
    }